

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedBrs.cpp
# Opt level: O3

bool __thiscall wasm::RemoveUnusedBrs::optimizeGC(RemoveUnusedBrs *this,Function *func)

{
  Module *pMVar1;
  char cVar2;
  ReFinalize local_248;
  undefined1 auStack_108 [8];
  Optimizer optimizer;
  
  pMVar1 = (this->
           super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
           ).super_PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>.
           super_Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>.
           currModule;
  if (((pMVar1->features).features & 0x400) == 0) {
    cVar2 = '\0';
  }
  else {
    auStack_108 = (undefined1  [8])0x0;
    optimizer.super_PostWalker<Optimizer,_wasm::Visitor<Optimizer,_void>_>.
    super_Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_>.replacep = (Expression **)0x0;
    optimizer.super_PostWalker<Optimizer,_wasm::Visitor<Optimizer,_void>_>.
    super_Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_>.currModule._0_1_ = '\0';
    optimizer.super_PostWalker<Optimizer,_wasm::Visitor<Optimizer,_void>_>.
    super_Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_>.stack.fixed._M_elems[9].currp =
         (Expression **)0x0;
    optimizer.super_PostWalker<Optimizer,_wasm::Visitor<Optimizer,_void>_>.
    super_Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_>.stack.flexible.
    super__Vector_base<wasm::Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_>::Task,_std::allocator<wasm::Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    optimizer.super_PostWalker<Optimizer,_wasm::Visitor<Optimizer,_void>_>.
    super_Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_>.stack.flexible.
    super__Vector_base<wasm::Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_>::Task,_std::allocator<wasm::Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    optimizer.super_PostWalker<Optimizer,_wasm::Visitor<Optimizer,_void>_>.
    super_Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_>.stack.flexible.
    super__Vector_base<wasm::Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_>::Task,_std::allocator<wasm::Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    optimizer.super_PostWalker<Optimizer,_wasm::Visitor<Optimizer,_void>_>.
    super_Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_>.stack.flexible.
    super__Vector_base<wasm::Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_>::Task,_std::allocator<wasm::Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
    optimizer.super_PostWalker<Optimizer,_wasm::Visitor<Optimizer,_void>_>.
    super_Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_>.currFunction._0_1_ = SUB81(pMVar1,0);
    optimizer.super_PostWalker<Optimizer,_wasm::Visitor<Optimizer,_void>_>.
    super_Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_>.currFunction._1_7_ =
         (undefined7)((ulong)pMVar1 >> 8);
    Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_>::walk
              ((Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_> *)auStack_108,&func->body);
    cVar2 = (char)optimizer.super_PostWalker<Optimizer,_wasm::Visitor<Optimizer,_void>_>.
                  super_Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_>.currModule;
    if ((char)optimizer.super_PostWalker<Optimizer,_wasm::Visitor<Optimizer,_void>_>.
              super_Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_>.currModule == '\x01') {
      ReFinalize::ReFinalize(&local_248);
      local_248.
      super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
      .super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.
      super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.currModule =
           (this->
           super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
           ).super_PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>.
           super_Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>.
           currModule;
      local_248.
      super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
      .super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.
      super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.currFunction
           = func;
      Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::walk
                (&local_248.
                  super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                  .
                  super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                  .super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>,
                 &func->body);
      local_248.
      super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
      .super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.
      super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.currFunction
           = (Function *)0x0;
      local_248.
      super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
      .super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.
      super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.currModule =
           (Module *)0x0;
      local_248.
      super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
      .super_Pass._vptr_Pass = (_func_int **)&PTR__ReFinalize_00d72330;
      std::
      _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_248.breakTypes._M_h);
      if (local_248.
          super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
          .super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.
          super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.stack.
          flexible.
          super__Vector_base<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task,_std::allocator<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_248.
                        super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                        .
                        super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                        .
                        super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                        .stack.flexible.
                        super__Vector_base<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task,_std::allocator<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_248.
                              super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                              .
                              super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                              .
                              super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                              .stack.flexible.
                              super__Vector_base<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task,_std::allocator<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_248.
                              super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                              .
                              super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                              .
                              super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                              .stack.flexible.
                              super__Vector_base<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task,_std::allocator<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      local_248.
      super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
      .super_Pass._vptr_Pass = (_func_int **)&PTR__Pass_00d722d8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248.
             super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
             .super_Pass.name._M_dataplus._M_p !=
          &local_248.
           super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
           .super_Pass.name.field_2) {
        operator_delete(local_248.
                        super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                        .super_Pass.name._M_dataplus._M_p,
                        local_248.
                        super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                        .super_Pass.name.field_2._M_allocated_capacity + 1);
      }
    }
    if (optimizer.super_PostWalker<Optimizer,_wasm::Visitor<Optimizer,_void>_>.
        super_Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_>.stack.fixed._M_elems[9].currp !=
        (Expression **)0x0) {
      operator_delete(optimizer.super_PostWalker<Optimizer,_wasm::Visitor<Optimizer,_void>_>.
                      super_Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_>.stack.fixed._M_elems
                      [9].currp,
                      (long)optimizer.super_PostWalker<Optimizer,_wasm::Visitor<Optimizer,_void>_>.
                            super_Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_>.stack.flexible.
                            super__Vector_base<wasm::Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_>::Task,_std::allocator<wasm::Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_>::Task>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)optimizer.super_PostWalker<Optimizer,_wasm::Visitor<Optimizer,_void>_>.
                            super_Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_>.stack.fixed.
                            _M_elems[9].currp);
    }
  }
  return (bool)cVar2;
}

Assistant:

bool optimizeGC(Function* func) {
    if (!getModule()->features.hasGC()) {
      return false;
    }

    struct Optimizer : public PostWalker<Optimizer> {
      bool worked = false;

      void visitBrOn(BrOn* curr) {
        // Ignore unreachable BrOns which we cannot improve anyhow. Note that
        // we must check the ref field manually, as we may be changing types as
        // we go here. (Another option would be to use a TypeUpdater here
        // instead of calling ReFinalize at the very end, but that would be more
        // complex and slower.)
        if (curr->type == Type::unreachable ||
            curr->ref->type == Type::unreachable) {
          return;
        }

        // First, check for a possible null which would prevent optimizations on
        // null checks.
        // TODO: Look into using BrOnNonNull here, to replace a br_on_func whose
        // input is (ref null func) with br_on_non_null (as only the null check
        // would be needed).
        // TODO: Use the fallthrough to determine in more cases that we
        // definitely have a null.
        auto refType = curr->ref->type;
        if (refType.isNullable() &&
            (curr->op == BrOnNull || curr->op == BrOnNonNull)) {
          return;
        }

        if (curr->op == BrOnNull) {
          assert(refType.isNonNullable());
          // This cannot be null, so the br is never taken, and the non-null
          // value flows through.
          replaceCurrent(curr->ref);
          worked = true;
          return;
        }
        if (curr->op == BrOnNonNull) {
          assert(refType.isNonNullable());
          // This cannot be null, so the br is always taken.
          replaceCurrent(
            Builder(*getModule()).makeBreak(curr->name, curr->ref));
          worked = true;
          return;
        }

        // Check if the type is the kind we are checking for.
        auto result = GCTypeUtils::evaluateCastCheck(refType, curr->castType);
        if (curr->op == BrOnCastFail) {
          result = GCTypeUtils::flipEvaluationResult(result);
        }

        if (result == GCTypeUtils::Success) {
          // The cast succeeds, so we can switch from BrOn to a simple br that
          // is always taken.
          replaceCurrent(
            Builder(*getModule()).makeBreak(curr->name, curr->ref));
          worked = true;
        } else if (result == GCTypeUtils::Failure) {
          // The cast fails, so the branch is never taken, and the value just
          // flows through.
          replaceCurrent(curr->ref);
          worked = true;
        }
        // TODO: Handle SuccessOnlyIfNull and SuccessOnlyIfNonNull.
      }
    } optimizer;

    optimizer.setModule(getModule());
    optimizer.doWalkFunction(func);

    // If we removed any BrOn instructions, that might affect the reachability
    // of the things they used to break to, so update types.
    if (optimizer.worked) {
      ReFinalize().walkFunctionInModule(func, getModule());
      return true;
    }
    return false;
  }